

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

uchar * __thiscall
CVmRun::get_prop(CVmRun *this,uint caller_ofs,vm_val_t *target_obj,vm_prop_id_t target_prop,
                vm_val_t *self,uint argc,vm_rcdesc *rc)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int found;
  uchar *puVar3;
  uint argc_local;
  vm_obj_id_t srcobj;
  vm_val_t *self_local;
  vm_val_t *target_obj_local;
  vm_val_t val;
  vm_val_t new_self;
  
  argc_local = argc;
  self_local = self;
  target_obj_local = target_obj;
  found = get_prop_no_eval(&target_obj_local,target_prop,&argc_local,&srcobj,&val,&self_local,
                           &new_self);
  if (G_predef_X.prop_not_defined_prop != 0 && found == 0) {
    found = get_prop_no_eval(&target_obj_local,G_predef_X.prop_not_defined_prop,&argc_local,&srcobj,
                             &val,&self_local,&new_self);
    pvVar2 = sp_;
    if (found == 0) {
      found = 0;
    }
    else if ((val.typ < VM_FIRST_INVALID_TYPE) &&
            ((0x60800U >> (val.typ & (VM_BIFPTR|VM_ENUM)) & 1) != 0)) {
      pvVar1 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar1 = VM_PROP;
      (pvVar2->val).prop = target_prop;
      argc_local = argc_local + 1;
      target_prop = G_predef_X.prop_not_defined_prop;
    }
  }
  puVar3 = eval_prop_val(this,found,caller_ofs,&val,(self_local->val).obj,target_prop,
                         target_obj_local,srcobj,argc_local,rc);
  return puVar3;
}

Assistant:

const uchar *CVmRun::get_prop(VMG_ uint caller_ofs,
                              const vm_val_t *target_obj,
                              vm_prop_id_t target_prop,
                              const vm_val_t *self, uint argc,
                              const vm_rcdesc *rc)
{
    vm_val_t val;
    vm_obj_id_t srcobj;
    int found;
    vm_val_t new_self;

    /* find the property without evaluating it */
    found = get_prop_no_eval(vmg_ &target_obj, target_prop,
                             &argc, &srcobj, &val, &self, &new_self);

    /* if we didn't find it, try propNotDefined */
    if (!found && G_predef->prop_not_defined_prop != VM_INVALID_PROP)
    {
        /* look up propNotDefined */
        found = get_prop_no_eval(vmg_ &target_obj,
                                 G_predef->prop_not_defined_prop,
                                 &argc, &srcobj, &val, &self, &new_self);

        /* if we found a method, set up to call it */
        if (found && (val.typ == VM_CODEOFS
                      || val.typ == VM_OBJX
                      || val.typ == VM_BIFPTRX))
        {
            /* 
             *   add the target property as the additional first argument to
             *   propNotDefined (we push backwards, so this will conveniently
             *   become the new first argument) 
             */
            push_prop(vmg_ target_prop);
            
            /* count the additional argument */
            ++argc;

            /* the property we're actually calling now is propNotDefined */
            target_prop = G_predef->prop_not_defined_prop;
        }
    }
    
    /* evaluate whatever we found or didn't find */
    return eval_prop_val(vmg_ found, caller_ofs, &val, self->val.obj,
                         target_prop, target_obj, srcobj, argc, rc);
}